

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
* __thiscall
kj::Arena::
allocate<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>,kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
          (Arena *this,
          Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
          *params)

{
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
  *location;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
  *params_00;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
  *result;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
  *params_local;
  Arena *this_local;
  
  location = (Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
              *)allocateBytes(this,0x10,8,true);
  params_00 = fwd<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
                        (params);
  ctor<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>,kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
            (location,params_00);
  setDestructor(this,location,
                destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
               );
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}